

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O0

void __thiscall
efsw::WatcherGeneric::WatcherGeneric
          (WatcherGeneric *this,WatchID id,string *directory,FileWatchListener *fwl,
          FileWatcherImpl *fw,bool recursive)

{
  DirWatcherGeneric *this_00;
  string local_58 [39];
  byte local_31;
  FileWatcherImpl *pFStack_30;
  bool recursive_local;
  FileWatcherImpl *fw_local;
  FileWatchListener *fwl_local;
  string *directory_local;
  WatchID id_local;
  WatcherGeneric *this_local;
  
  local_31 = recursive;
  pFStack_30 = fw;
  fw_local = (FileWatcherImpl *)fwl;
  fwl_local = (FileWatchListener *)directory;
  directory_local = (string *)id;
  id_local = (WatchID)this;
  std::__cxx11::string::string(local_58,(string *)directory);
  Watcher::Watcher(&this->super_Watcher,id,(string *)local_58,(FileWatchListener *)fw_local,
                   (bool)(local_31 & 1));
  std::__cxx11::string::~string(local_58);
  (this->super_Watcher)._vptr_Watcher = (_func_int **)&PTR__WatcherGeneric_00184be8;
  this->WatcherImpl = pFStack_30;
  this->DirWatch = (DirWatcherGeneric *)0x0;
  FileSystem::dirAddSlashAtEnd(&(this->super_Watcher).Directory);
  this_00 = (DirWatcherGeneric *)operator_new(0xc0);
  DirWatcherGeneric::DirWatcherGeneric
            (this_00,(DirWatcherGeneric *)0x0,this,(string *)fwl_local,(bool)(local_31 & 1),false);
  this->DirWatch = this_00;
  DirWatcherGeneric::addChilds(this->DirWatch,false);
  return;
}

Assistant:

WatcherGeneric::WatcherGeneric( WatchID id, const std::string& directory, FileWatchListener* fwl,
								FileWatcherImpl* fw, bool recursive ) :
	Watcher( id, directory, fwl, recursive ), WatcherImpl( fw ), DirWatch( NULL ) {
	FileSystem::dirAddSlashAtEnd( Directory );

	DirWatch = new DirWatcherGeneric( NULL, this, directory, recursive, false );

	DirWatch->addChilds( false );
}